

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

mapped_type * __thiscall
wasm::
getModuleElement<std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>>
          (wasm *this,
          unordered_map<wasm::Name,_wasm::Export_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>_>
          *m,Name name,string *funcName)

{
  ostream *this_00;
  __node_base_ptr p_Var1;
  char *__code;
  _Hash_node_base *p_Var2;
  Name name_00;
  undefined1 local_1b0 [392];
  undefined1 local_28 [8];
  Name name_local;
  
  __code = name.super_IString.str._M_len;
  p_Var2 = (_Hash_node_base *)0x0;
  local_28 = (undefined1  [8])m;
  name_local.super_IString.str._M_len = (size_t)__code;
  p_Var1 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Export_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Export_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this,(ulong)__code % *(ulong *)(this + 8),(key_type *)local_28,
                      (__hash_code)__code);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var2 = p_Var1->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    return (mapped_type *)(p_Var2 + 3);
  }
  Fatal::Fatal((Fatal *)local_1b0);
  this_00 = (ostream *)(local_1b0 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"Module::",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (this_00,*(char **)name.super_IString.str._M_str,
             *(long *)(name.super_IString.str._M_str + 8));
  std::__ostream_insert<char,std::char_traits<char>>(this_00,": ",2);
  name_00.super_IString.str._M_str = __code;
  name_00.super_IString.str._M_len = name_local.super_IString.str._M_len;
  operator<<((wasm *)this_00,(ostream *)local_28,name_00);
  Fatal::operator<<((Fatal *)local_1b0,(char (*) [16])" does not exist");
  Fatal::~Fatal((Fatal *)local_1b0);
}

Assistant:

typename Map::mapped_type&
getModuleElement(Map& m, Name name, const std::string& funcName) {
  auto iter = m.find(name);
  if (iter == m.end()) {
    Fatal() << "Module::" << funcName << ": " << name << " does not exist";
  }
  return iter->second;
}